

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

void __thiscall spectest::JSONParser::PrintError(JSONParser *this,char *format,...)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  FILE *__stream;
  int iVar4;
  size_t __maxlen;
  char *__s;
  undefined8 uStack_1c0;
  char local_1b8 [8];
  char fixed_buf [128];
  undefined8 local_88 [4];
  undefined8 local_68;
  va_list args;
  undefined8 local_48;
  va_list args_copy;
  
  args[0].overflow_arg_area = fixed_buf + 0x78;
  local_68 = 0x3000000010;
  args[0]._0_8_ = &stack0x00000008;
  local_48 = 0x3000000010;
  __s = local_1b8;
  uStack_1c0 = 0x11ab0c;
  args_copy[0]._0_8_ = args[0]._0_8_;
  args_copy[0].overflow_arg_area = args[0].overflow_arg_area;
  iVar4 = vsnprintf(__s,0x80,format,&local_68);
  __maxlen = (long)iVar4 + 1;
  if (0x80 < __maxlen) {
    lVar3 = -((long)iVar4 + 0x10U & 0xfffffffffffffff0);
    __s = local_1b8 + lVar3;
    *(undefined8 *)((long)&uStack_1c0 + lVar3) = 0x11ab3b;
    vsnprintf(__s,__maxlen,format,&local_48);
  }
  __stream = _stderr;
  __s[-8] = 'Y';
  __s[-7] = -0x55;
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_88,&(this->loc_).filename,
             (allocator<char> *)((long)&args_copy[0].reg_save_area + 7));
  uVar1 = (this->loc_).field_1.field_0.line;
  uVar2 = (this->loc_).field_1.field_0.first_column;
  __s[-8] = 'x';
  __s[-7] = -0x55;
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  fprintf(__stream,"%s:%d:%d: %s\n",local_88[0],(ulong)uVar1,(ulong)uVar2,__s);
  __s[-8] = -0x80;
  __s[-7] = -0x55;
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void JSONParser::PrintError(const char* format, ...) {
  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  fprintf(stderr, "%s:%d:%d: %s\n", std::string(loc_.filename).c_str(),
          loc_.line, loc_.first_column, buffer);
}